

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
          (ConstraintExprVisitor *this,UnbasedUnsizedIntegerLiteral *expr)

{
  ExpressionKind EVar1;
  int iVar2;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar3;
  size_type sVar4;
  long lVar5;
  Type *pTVar6;
  bool bVar7;
  RandMode RVar8;
  SubroutineKind SVar9;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar10;
  Diagnostic *diag;
  SourceLocation SVar11;
  long lVar13;
  DiagCode code;
  ASTContext *this_01;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  SourceLocation SVar12;
  
  if (this->failed != false) goto LAB_00252c10;
  if (((this->isSoft == true) &&
      (symbol = Expression::getSymbolReference(&expr->super_Expression,true),
      symbol != (Symbol *)0x0)) &&
     (RVar8 = ASTContext::getRandMode(this->context,symbol), RVar8 == RandC)) {
    ASTContext::addDiag(this->context,(DiagCode)0x340008,(expr->super_Expression).sourceRange);
  }
  EVar1 = (expr->super_Expression).kind;
  bVar7 = true;
  if (0x14 < (int)EVar1) {
    switch(EVar1) {
    case OpenRange:
      goto switchD_00252af9_caseD_1f;
    case Dist:
      local_30 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_28 = local_28 & 0xffffff00;
      this_00 = *(Expression **)&expr->value;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                (this_00,this_00,(DistVarVisitor *)&local_30);
      if ((char)local_28 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x370008,this_00->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00252af9_caseD_21;
    case NewCovergroup:
      break;
    default:
      if (EVar1 == Call) {
        SVar9 = CallExpression::getSubroutineKind((CallExpression *)expr);
        if (SVar9 == Task) {
          this_01 = this->context;
          SVar12 = (expr->super_Expression).sourceRange.startLoc;
          SVar11 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x44;
          goto LAB_00252c07;
        }
        if (*(char *)&expr[1].super_Expression.sourceRange.endLoc != '\x01') {
          ppSVar10 = std::
                     get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                               ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                                 *)&expr->value);
          pSVar3 = *ppSVar10;
          if ((pSVar3->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&pSVar3->super_Scope);
          }
          sVar4 = (pSVar3->arguments).size_;
          if (sVar4 != 0) {
            lVar13 = 0;
            do {
              lVar5 = *(long *)((long)(pSVar3->arguments).data_ + lVar13);
              iVar2 = *(int *)(lVar5 + 0x90);
              if (iVar2 == 3) {
                if ((*(byte *)(lVar5 + 0x8c) & 1) == 0) goto LAB_00252cc9;
              }
              else if (iVar2 == 1) {
LAB_00252cc9:
                this_01 = this->context;
                SVar12 = (expr->super_Expression).sourceRange.startLoc;
                SVar11 = (expr->super_Expression).sourceRange.endLoc;
                code.subsystem = Statements;
                code.code = 0x2d;
                goto LAB_00252c07;
              }
              lVar13 = lVar13 + 8;
            } while (sVar4 << 3 != lVar13);
          }
        }
      }
    }
    goto switchD_00252acc_caseD_5;
  }
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_30,(SVIntStorage *)(expr + 1));
    goto LAB_00252ba2;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2a;
    break;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_30);
LAB_00252ba2:
    if ((0x40 < local_28 || (local_23 & 1) != 0) && ((void *)local_30.val != (void *)0x0)) {
      operator_delete__(local_30.pVal);
    }
    if ((local_23 & 1) == 0) {
      return true;
    }
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x49;
    break;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case NamedValue:
  case HierarchicalValue:
  case UnaryOp:
    goto switchD_00252acc_caseD_5;
  case BinaryOp:
    if ((0x12 < *(uint *)&expr->value) || ((0x61800U >> (*(uint *)&expr->value & 0x1f) & 1) == 0))
    goto switchD_00252acc_caseD_5;
switchD_00252af9_caseD_21:
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar11 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x13;
    break;
  default:
    if (EVar1 == Streaming) goto switchD_00252af9_caseD_21;
switchD_00252acc_caseD_5:
    pTVar6 = (expr->super_Expression).type.ptr;
    if (pTVar6 == (Type *)0x0) {
LAB_00252cde:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    bVar7 = Type::isValidForRand(pTVar6,Rand);
    if (bVar7) {
      return true;
    }
    diag = ASTContext::addDiag(this->context,(DiagCode)0x290008,(expr->super_Expression).sourceRange
                              );
    pTVar6 = (expr->super_Expression).type.ptr;
    if (pTVar6 == (Type *)0x0) goto LAB_00252cde;
    ast::operator<<(diag,pTVar6);
    goto LAB_00252c0c;
  }
LAB_00252c07:
  sourceRange.endLoc = SVar11;
  sourceRange.startLoc = SVar12;
  ASTContext::addDiag(this_01,code,sourceRange);
LAB_00252c0c:
  this->failed = true;
LAB_00252c10:
  bVar7 = false;
switchD_00252af9_caseD_1f:
  return bVar7;
}

Assistant:

bool visit(const T& expr) {
        if (failed)
            return false;

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (isSoft) {
                if (auto sym = expr.getSymbolReference()) {
                    RandMode mode = context.getRandMode(*sym);
                    if (mode == RandMode::RandC)
                        context.addDiag(diag::RandCInSoft, expr.sourceRange);
                }
            }

            if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {
                    expr.visitExprs(*this);
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                    return visitInvalid(expr);
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return visitInvalid(expr);
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    switch (expr.template as<BinaryExpression>().op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return visitInvalid(expr);
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::OpenRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return visitInvalid(expr);
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return visitInvalid(expr);
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!expr.type->isValidForRand(RandMode::Rand)) {
                context.addDiag(diag::NonIntegralConstraintExpr, expr.sourceRange) << *expr.type;
                return visitInvalid(expr);
            }
        }

        return true;
    }